

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O3

void __thiscall
write_ini_item::operator()(write_ini_item *this,sector_item *item,xr_ini_writer *w,uint32_t id)

{
  pointer pcVar1;
  int iVar2;
  char buf [128];
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  char local_a8 [128];
  
  iVar2 = snprintf(local_a8,0x80,"item_mesh_name_%04d");
  if (0 < iVar2) {
    pcVar1 = (item->mesh)._M_dataplus._M_p;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar1,pcVar1 + (item->mesh)._M_string_length);
    xray_re::xr_ini_writer::write(w,(int)local_a8,(string *)local_c8,0);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
  }
  iVar2 = snprintf(local_a8,0x80,"item_object_name_%04d");
  if (0 < iVar2) {
    pcVar1 = (item->object)._M_dataplus._M_p;
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,pcVar1,pcVar1 + (item->object)._M_string_length);
    xray_re::xr_ini_writer::write(w,(int)local_a8,local_e8,0);
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
  }
  return;
}

Assistant:

void operator()(const sector_item& item, xr_ini_writer* w, uint32_t id) const {
	char buf[128];
	int n = xr_snprintf(buf, sizeof(buf), "item_mesh_name_%04d", id);
	if (n > 0)
		w->write(buf, item.mesh, false);

	n = xr_snprintf(buf, sizeof(buf), "item_object_name_%04d", id);
	if (n > 0)
		w->write(buf, item.object, false);
}